

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::delete_widget(Fl_Widget *wi)

{
  undefined1 auVar1 [16];
  int iVar2;
  Fl_Window *this;
  ulong uVar3;
  Fl_Widget **__dest;
  Fl_Widget **temp;
  int i;
  Fl_Window *win;
  Fl_Widget *wi_local;
  undefined4 extraout_var;
  
  if (wi != (Fl_Widget *)0x0) {
    iVar2 = Fl_Widget::visible_r(wi);
    if (iVar2 != 0) {
      (*wi->_vptr_Fl_Widget[6])();
    }
    iVar2 = (*wi->_vptr_Fl_Widget[8])();
    this = (Fl_Window *)CONCAT44(extraout_var,iVar2);
    if ((this != (Fl_Window *)0x0) && (iVar2 = Fl_Window::shown(this), iVar2 != 0)) {
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    for (temp._4_4_ = 0; temp._4_4_ < num_dwidgets; temp._4_4_ = temp._4_4_ + 1) {
      if (dwidgets[temp._4_4_] == wi) {
        return;
      }
    }
    if (alloc_dwidgets <= num_dwidgets) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(alloc_dwidgets + 10);
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      __dest = (Fl_Widget **)operator_new__(uVar3);
      if ((alloc_dwidgets != 0) &&
         (memcpy(__dest,dwidgets,(long)alloc_dwidgets << 3), dwidgets != (Fl_Widget **)0x0)) {
        operator_delete__(dwidgets);
      }
      alloc_dwidgets = alloc_dwidgets + 10;
      dwidgets = __dest;
    }
    dwidgets[num_dwidgets] = wi;
    num_dwidgets = num_dwidgets + 1;
  }
  return;
}

Assistant:

void Fl::delete_widget(Fl_Widget *wi) {
  if (!wi) return;

  // if the widget is shown(), hide() it (FLTK 1.3.4)
  if (wi->visible_r()) wi->hide();
  Fl_Window *win = wi->as_window();
  if (win && win->shown()) win->hide(); // case of iconified window

  // don't add the same widget twice to the widget delete list
  for (int i = 0; i < num_dwidgets; i++) {
    if (dwidgets[i]==wi) return;
  }

  if (num_dwidgets >= alloc_dwidgets) {
    Fl_Widget	**temp;

    temp = new Fl_Widget *[alloc_dwidgets + 10];
    if (alloc_dwidgets) {
      memcpy(temp, dwidgets, alloc_dwidgets * sizeof(Fl_Widget *));
      delete[] dwidgets;
    }

    dwidgets = temp;
    alloc_dwidgets += 10;
  }

  dwidgets[num_dwidgets] = wi;
  num_dwidgets ++;
}